

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O2

void sig_err_handler(int sig)

{
  tester_list_t *ptVar1;
  pid_list_item_t *ppVar2;
  pid_t pVar3;
  __pid_t _Var4;
  tester_list_t **pptVar5;
  pid_list_item_t **pppVar6;
  _Bool local_29 [8];
  _Bool ignored_err;
  
  pVar3 = main_pid;
  local_29[0] = false;
  _Var4 = getpid();
  if (pVar3 == _Var4) {
    pptVar5 = &tester_data;
    while (ptVar1 = *pptVar5, ptVar1 != (tester_list_t *)0x0) {
      if (ptVar1->this != (tester_t *)0x0) {
        kill(ptVar1->this->pid,0xf);
      }
      pptVar5 = &ptVar1->next;
    }
    pppVar6 = &children;
    while (ppVar2 = *pppVar6, ppVar2 != (pid_list_item_t *)0x0) {
      if (ppVar2->pid != -1) {
        kill(ppVar2->pid,0xf);
      }
      pppVar6 = &ppVar2->next;
    }
  }
  validator_mq_finish(pVar3 == _Var4,validator_mq,local_29);
  tester_mq_finish(false,current_tester_mq,(char *)0x0,local_29);
  exit(1);
}

Assistant:

static void sig_err_handler(int sig) {
    UNUSED(sig);

    bool ignored_err = false;
    if(main_pid == getpid()) {
        for(tester_list_t *iter = tester_data; iter != NULL; iter = iter->next) {
            if(iter->this != NULL) {
                kill(iter->this->pid, SIGTERM);
            }
        }
        for(pid_list_item_t *iter = children; iter != NULL; iter = iter->next) {
            if(iter->pid != PID_LIST_EMPTY_ITEM_PID) {
                kill(iter->pid, SIGTERM);
            }
        }
        validator_mq_finish(true, validator_mq, &ignored_err);
    } else {
        validator_mq_finish(false, validator_mq, &ignored_err);
    }
    tester_mq_finish(false, current_tester_mq, NULL, &ignored_err);
    // free is not a safe async function => have to rely on system to clean the list's dynamic memory
    exit(EXIT_FAILURE);
}